

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O3

CollectorResult __thiscall
Simple::Lib::
ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
::emit(ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int args_1)

{
  int iVar1;
  pointer pcVar2;
  SignalLink *this_00;
  undefined8 uVar3;
  SignalLink *this_01;
  int local_74;
  long *local_70;
  long local_68;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = this->callback_ring_;
  if (this_01 != (SignalLink *)0x0) {
    iVar1 = this_01->ref_count;
    this_01->ref_count = iVar1 + 1;
    if (iVar1 < 0) {
LAB_00107d4f:
      __assert_fail("ref_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                    ,0x51,
                    "void Simple::Lib::ProtoSignal<void (std::basic_string<char>, int), Simple::Lib::CollectorDefault<void>>::SignalLink::incref()"
                   );
    }
    do {
      if ((this_01->function).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_70 = local_60;
        pcVar2 = (args->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + args->_M_string_length);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_70,local_68 + (long)local_70);
        local_74 = args_1;
        if ((this_01->function).super__Function_base._M_manager == (_Manager_type)0x0) {
          uVar3 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          _Unwind_Resume(uVar3);
        }
        (*(this_01->function)._M_invoker)((_Any_data *)&this_01->function,&local_50,&local_74);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
      }
      this_00 = this_01->next;
      iVar1 = this_00->ref_count;
      this_00->ref_count = iVar1 + 1;
      if (iVar1 < 0) goto LAB_00107d4f;
      SignalLink::decref(this_01);
      this_01 = this_00;
    } while (this_00 != this->callback_ring_);
    SignalLink::decref(this_00);
  }
  return;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }